

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O1

void print_dict(ObjDict *dict,_Bool new_line)

{
  HTKeyType HVar1;
  HTItem **ppHVar2;
  ulong uVar3;
  ulong uVar4;
  undefined7 in_register_00000031;
  char *pcVar5;
  char *pcVar6;
  HTItem *pHVar7;
  bool bVar8;
  CrispyValue value;
  
  pcVar5 = "\n";
  bVar8 = (int)CONCAT71(in_register_00000031,new_line) == 0;
  if (bVar8) {
    pcVar5 = "";
  }
  pcVar6 = "\t";
  if (bVar8) {
    pcVar6 = "";
  }
  HVar1 = (dict->content).key_type;
  uVar4 = (ulong)(dict->content).cap;
  ppHVar2 = (dict->content).buckets;
  printf("{%s");
  if (uVar4 != 0) {
    bVar8 = true;
    uVar3 = 0;
    do {
      for (pHVar7 = ppHVar2[uVar3]; pHVar7 != (HTItem *)0x0; pHVar7 = pHVar7->next) {
        if (bVar8) {
          bVar8 = false;
        }
        else {
          printf(", ");
        }
        printf("%s\"",pcVar6);
        if (HVar1 < 4) {
          (*(code *)(&DAT_001093b8 + *(int *)(&DAT_001093b8 + (ulong)HVar1 * 4)))();
          return;
        }
        printf("\": ");
        value._4_4_ = 0;
        value.type = (pHVar7->value).type;
        value.field_1.p_value = (pHVar7->value).field_1.p_value;
        print_value(value,new_line,true);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar4);
  }
  printf("}%s",pcVar5);
  return;
}

Assistant:

void print_dict(ObjDict *dict, bool new_line) {
    const char *nl = (new_line) ? "\n" : "";
    const char *tab = (new_line) ? "\t" : "";

    HashTable ht = dict->content;

    printf("{%s", nl);
    bool first = true;

    for (uint32_t i = 0; i < ht.cap; ++i) {
        HTItem *bucket = ht.buckets[i];
        while (bucket) {
            if (first) {
                first = false;
            } else {
                printf(", ");
            }
            printf("%s\"", tab);
            print_ht_key(ht.key_type, bucket->key);
            printf("\": ");
            print_value(bucket->value, new_line, true);

            bucket = bucket->next;
        }
    }

    printf("}%s", nl);
}